

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Geometry::Geometry
          (Geometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Connection *con;
  Skin *pSVar1;
  pointer ppCVar2;
  BlendShape *bsp;
  BlendShape *local_50;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_48;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Geometry_00821860;
  this->skin = (Skin *)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_48,doc,(this->super_Object).id,"Deformer");
  for (ppCVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
    con = *ppCVar2;
    pSVar1 = Util::ProcessSimpleConnection<Assimp::FBX::Skin>
                       (con,false,"Skin -> Geometry",element,(char **)0x0);
    if (pSVar1 != (Skin *)0x0) {
      this->skin = pSVar1;
    }
    local_50 = Util::ProcessSimpleConnection<Assimp::FBX::BlendShape>
                         (con,false,"BlendShape -> Geometry",element,(char **)0x0);
    if (local_50 != (BlendShape *)0x0) {
      std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
      ::push_back(&this->blendShapes,&local_50);
    }
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

Geometry::Geometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
    : Object(id, element, name)
    , skin()
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Deformer");
    for(const Connection* con : conns) {
        const Skin* const sk = ProcessSimpleConnection<Skin>(*con, false, "Skin -> Geometry", element);
        if(sk) {
            skin = sk;
        }
        const BlendShape* const bsp = ProcessSimpleConnection<BlendShape>(*con, false, "BlendShape -> Geometry", element);
        if (bsp) {
            blendShapes.push_back(bsp);
        }
    }
}